

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.h
# Opt level: O3

void __thiscall
jbcoin::STPathElement::STPathElement
          (STPathElement *this,AccountID *account,Currency *currency,AccountID *issuer,
          bool forceCurrency)

{
  ulong uVar1;
  undefined8 uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  
  this->mType = 0;
  (this->mAccountID).pn[4] = account->pn[4];
  uVar2 = *(undefined8 *)(account->pn + 2);
  *(undefined8 *)(this->mAccountID).pn = *(undefined8 *)account->pn;
  *(undefined8 *)((this->mAccountID).pn + 2) = uVar2;
  uVar2 = *(undefined8 *)(currency->pn + 2);
  *(undefined8 *)(this->mCurrencyID).pn = *(undefined8 *)currency->pn;
  *(undefined8 *)((this->mCurrencyID).pn + 2) = uVar2;
  (this->mCurrencyID).pn[4] = currency->pn[4];
  (this->mIssuerID).pn[4] = issuer->pn[4];
  uVar2 = *(undefined8 *)(issuer->pn + 2);
  *(undefined8 *)(this->mIssuerID).pn = *(undefined8 *)issuer->pn;
  *(undefined8 *)((this->mIssuerID).pn + 2) = uVar2;
  if ((this->mAccountID).pn[0] == 0) {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 3) {
        this->is_offer_ = true;
        uVar4 = 0;
        goto LAB_001ea5ab;
      }
      uVar1 = uVar5 + 1;
      lVar3 = uVar5 + 2;
      uVar5 = uVar1;
    } while ((this->mAccountID).pn[lVar3] == 0);
    uVar4 = 0;
    this->is_offer_ = uVar1 >= 4;
    if (uVar1 < 4) goto LAB_001ea56f;
  }
  else {
    this->is_offer_ = false;
LAB_001ea56f:
    this->mType = 1;
    uVar4 = 1;
  }
LAB_001ea5ab:
  if ((forceCurrency) || (currency->pn[0] != 0)) {
LAB_001ea5d6:
    uVar4 = uVar4 | 0x10;
    this->mType = uVar4;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 3) goto LAB_001ea5db;
      uVar1 = uVar5 + 1;
      lVar3 = uVar5 + 2;
      uVar5 = uVar1;
    } while (currency->pn[lVar3] == 0);
    if (uVar1 < 4) goto LAB_001ea5d6;
  }
LAB_001ea5db:
  if (issuer->pn[0] == 0) {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 3) goto LAB_001ea5e5;
      uVar1 = uVar5 + 1;
      lVar3 = uVar5 + 2;
      uVar5 = uVar1;
    } while (issuer->pn[lVar3] == 0);
    if (3 < uVar1) goto LAB_001ea5e5;
  }
  this->mType = uVar4 | 0x20;
LAB_001ea5e5:
  sVar6 = get_hash(this);
  this->hash_value_ = sVar6;
  return;
}

Assistant:

STPathElement (
        AccountID const& account, Currency const& currency,
        AccountID const& issuer, bool forceCurrency = false)
        : mType (typeNone), mAccountID (account), mCurrencyID (currency)
        , mIssuerID (issuer), is_offer_ (isXRP(mAccountID))
    {
        if (!is_offer_)
            mType |= typeAccount;

        if (forceCurrency || !isXRP(currency))
            mType |= typeCurrency;

        if (!isXRP(issuer))
            mType |= typeIssuer;

        hash_value_ = get_hash (*this);
    }